

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

void __thiscall
itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::assign_impl
          (small_vector<float,_4UL,_0UL,_std::allocator<float>_> *this,size_type count,float *value)

{
  float fVar1;
  float *pfVar2;
  float *pfVar3;
  size_t sVar4;
  
  pfVar2 = choose_data(this,count);
  this->m_end = pfVar2;
  this->m_begin = pfVar2;
  if (count != 0) {
    fVar1 = *value;
    pfVar3 = pfVar2;
    do {
      *pfVar3 = fVar1;
      pfVar3 = pfVar3 + 1;
      count = count - 1;
    } while (count != 0);
    this->m_end = pfVar3;
  }
  sVar4 = 4;
  if ((type *)pfVar2 != this->m_static_data) {
    sVar4 = this->m_dynamic_capacity;
  }
  this->m_capacity = sVar4;
  return;
}

Assistant:

void assign_impl(size_type count, const T& value)
    {
        assert(m_begin);
        assert(m_begin == m_end);

        m_begin = m_end = choose_data(count);
        for (size_type i = 0; i < count; ++i)
        {
            atraits::construct(get_alloc(), m_end, value);
            ++m_end;
        }

        update_capacity();
    }